

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest(FILE *out,UnitTest *unit_test)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  TestCase *test_case;
  TimeInMillis ms;
  int i;
  int i_00;
  string local_50;
  
  fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)out);
  uVar1 = UnitTest::total_test_count(unit_test);
  uVar2 = UnitTest::failed_test_count(unit_test);
  uVar3 = UnitTest::disabled_test_count(unit_test);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_50,(internal *)unit_test->impl_->elapsed_time_,ms);
  i_00 = 0;
  fprintf((FILE *)out,
          "<testsuites tests=\"%d\" failures=\"%d\" disabled=\"%d\" errors=\"0\" time=\"%s\" ",
          (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  if (FLAGS_gtest_shuffle == '\x01') {
    fprintf((FILE *)out,"random_seed=\"%d\" ",(ulong)(uint)unit_test->impl_->random_seed_);
  }
  fwrite("name=\"AllTests\">\n",0x11,1,(FILE *)out);
  for (; i_00 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                    super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(unit_test->impl_->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1
      ) {
    test_case = UnitTest::GetTestCase(unit_test,i_00);
    PrintXmlTestCase(out,test_case);
  }
  fwrite("</testsuites>\n",0xe,1,(FILE *)out);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(FILE* out,
                                                const UnitTest& unit_test) {
  fprintf(out, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  fprintf(out,
          "<testsuites tests=\"%d\" failures=\"%d\" disabled=\"%d\" "
          "errors=\"0\" time=\"%s\" ",
          unit_test.total_test_count(),
          unit_test.failed_test_count(),
          unit_test.disabled_test_count(),
          FormatTimeInMillisAsSeconds(unit_test.elapsed_time()).c_str());
  if (GTEST_FLAG(shuffle)) {
    fprintf(out, "random_seed=\"%d\" ", unit_test.random_seed());
  }
  fprintf(out, "name=\"AllTests\">\n");
  for (int i = 0; i < unit_test.total_test_case_count(); ++i)
    PrintXmlTestCase(out, *unit_test.GetTestCase(i));
  fprintf(out, "</testsuites>\n");
}